

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_graph.c
# Opt level: O0

void graph_delete(t_gobj *z,_glist *glist)

{
  int iVar1;
  t_gobj *y;
  _glist *x;
  _glist *glist_local;
  t_gobj *z_local;
  
  while (z[3].g_pd != (t_pd)0x0) {
    glist_delete((_glist *)z,(t_gobj *)z[3].g_pd);
  }
  iVar1 = glist_isvisible((_glist *)z);
  if (iVar1 != 0) {
    text_delete(z,glist);
  }
  canvas_deletelinesfor(glist,(t_text *)z);
  return;
}

Assistant:

static void graph_delete(t_gobj *z, t_glist *glist)
{
    t_glist *x = (t_glist *)z;
    t_gobj *y;
    while ((y = x->gl_list))
        glist_delete(x, y);
    if (glist_isvisible(x))
        text_widgetbehavior.w_deletefn(z, glist);
            /* if we have connections to the actual 'canvas' object, zap
            them as well (e.g., array or scalar objects that are implemented
            as canvases with "real" inlets).  Connections to ordinary canvas
            in/outlets already got zapped when we cleared the contents above */
    canvas_deletelinesfor(glist, &x->gl_obj);
}